

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O0

void __thiscall PeleLM::post_init(PeleLM *this,Real stop_time)

{
  Real RVar1;
  FabArrayBase *this_00;
  FabFactory<amrex::FArrayBox> *pFVar2;
  PeleLM *pPVar3;
  double *pdVar4;
  ostream *os_;
  long *in_RDI;
  Real run_time;
  int IOProc;
  int k_3;
  Vector<double,_std::allocator<double>_> dt_level;
  MultiFab *S_crse;
  MultiFab *S_fine;
  PeleLM *crse_lev_2;
  PeleLM *fine_lev_2;
  int k_2;
  MultiFab *divu_lev_3;
  int lev_5;
  Real Ssum_1;
  MultiFab *divu_lev_2;
  int lev_4;
  int havedivu;
  Real divu_time;
  MultiFab *Divu_fine_1;
  MultiFab *Divu_crse_1;
  PeleLM *crse_lev_1;
  PeleLM *fine_lev_1;
  int lev_3;
  MultiFab *Divu_new;
  int k_1;
  MultiFab Forcing_tmp;
  MultiFab S_tmp;
  MultiFab *S_new;
  int k;
  int iter;
  int in_stack_000007b0;
  int in_stack_000007b4;
  Real in_stack_000007b8;
  int in_stack_000007c4;
  Projection *in_stack_000007c8;
  int init_divu_iter;
  bool do_iter;
  MultiFab *divu_lev_1;
  int lev_2;
  Real Ssum;
  MultiFab *divu_lev;
  int lev_1;
  MultiFab *Divu_fine;
  MultiFab *Divu_crse;
  PeleLM *crse_lev;
  PeleLM *fine_lev;
  int lev;
  Vector<int,_std::allocator<int>_> nc_save2;
  Vector<double,_std::allocator<double>_> dt_save2;
  Vector<int,_std::allocator<int>_> nc_save;
  Vector<double,_std::allocator<double>_> dt_save;
  Real Sbar;
  Real dt_init2;
  Real dt_init;
  int finest_level;
  Real tnp1;
  Real strt_time;
  MultiFab *in_stack_00000d98;
  Real in_stack_00000da0;
  MultiFab *in_stack_00000da8;
  MultiFab *in_stack_00000db0;
  PeleLM *in_stack_00000db8;
  allocator_type *in_stack_fffffffffffff5d8;
  int iVar5;
  int in_stack_fffffffffffff5e0;
  int in_stack_fffffffffffff5e4;
  MultiFab *in_stack_fffffffffffff5e8;
  NavierStokesBase *in_stack_fffffffffffff5f0;
  StateData *in_stack_fffffffffffff600;
  ostream *in_stack_fffffffffffff608;
  Print *in_stack_fffffffffffff610;
  PeleLM *in_stack_fffffffffffff618;
  MultiFab *in_stack_fffffffffffff620;
  FabFactory<amrex::FArrayBox> *in_stack_fffffffffffff630;
  PeleLM *in_stack_fffffffffffff650;
  BoxArray *in_stack_fffffffffffff6d0;
  Vector<double,_std::allocator<double>_> *in_stack_fffffffffffff6d8;
  undefined4 in_stack_fffffffffffff6e0;
  int in_stack_fffffffffffff6e4;
  PeleLM *in_stack_fffffffffffff6e8;
  PeleLM *in_stack_fffffffffffff6f0;
  int local_8f0;
  double local_6d8;
  int local_6cc;
  int local_6c8;
  MultiFab *local_6a8;
  MultiFab *local_6a0;
  PeleLM *local_698;
  PeleLM *local_690;
  int local_684;
  MultiFab *local_680;
  int local_674;
  Real local_670;
  MultiFab *local_668;
  int local_660;
  undefined4 local_65c;
  Real local_658;
  MultiFab *local_650;
  MultiFab *local_648;
  PeleLM *local_640;
  PeleLM *local_638;
  int local_62c;
  MultiFab *local_628;
  int local_61c;
  undefined8 local_618;
  undefined8 uStack_610;
  undefined8 local_608;
  undefined8 uStack_600;
  undefined8 local_5f8;
  PeleLM *in_stack_fffffffffffffa28;
  Vector<double,_std::allocator<double>_> *in_stack_fffffffffffffa88;
  Vector<int,_std::allocator<int>_> *in_stack_fffffffffffffa90;
  Real *in_stack_fffffffffffffa98;
  PeleLM *in_stack_fffffffffffffaa0;
  int in_stack_fffffffffffffb3c;
  MultiFab *in_stack_fffffffffffffb40;
  PeleLM *in_stack_fffffffffffffb48;
  int local_2b0;
  int local_2ac;
  int local_10c;
  int local_f4;
  int local_d0;
  NavierStokesBase *in_stack_ffffffffffffffa8;
  double local_38;
  double local_30;
  int local_24;
  Real local_20;
  double local_18;
  
  if ((int)in_RDI[1] < 1) {
    local_18 = amrex::ParallelDescriptor::second();
    amrex::Vector<amrex::StateData,_std::allocator<amrex::StateData>_>::operator[]
              ((Vector<amrex::StateData,_std::allocator<amrex::StateData>_> *)
               CONCAT44(in_stack_fffffffffffff5e4,in_stack_fffffffffffff5e0),
               (size_type)in_stack_fffffffffffff5d8);
    local_20 = amrex::StateData::curTime(in_stack_fffffffffffff600);
    local_24 = amrex::AmrMesh::finestLevel((AmrMesh *)in_RDI[0x2a]);
    local_30 = 0.0;
    local_38 = 0.0;
    std::allocator<double>::allocator((allocator<double> *)0x4f4251);
    amrex::Vector<double,_std::allocator<double>_>::vector
              ((Vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_fffffffffffff5e4,in_stack_fffffffffffff5e0),
               (size_type)in_stack_fffffffffffff5d8,(allocator_type *)0x4f426e);
    std::allocator<double>::~allocator((allocator<double> *)0x4f427d);
    std::allocator<int>::allocator((allocator<int> *)0x4f42a5);
    amrex::Vector<int,_std::allocator<int>_>::vector
              ((Vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffff5e4,in_stack_fffffffffffff5e0),
               (size_type)in_stack_fffffffffffff5d8,(allocator_type *)0x4f42c2);
    std::allocator<int>::~allocator((allocator<int> *)0x4f42d1);
    std::allocator<double>::allocator((allocator<double> *)0x4f42f9);
    amrex::Vector<double,_std::allocator<double>_>::vector
              ((Vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_fffffffffffff5e4,in_stack_fffffffffffff5e0),
               (size_type)in_stack_fffffffffffff5d8,(allocator_type *)0x4f4316);
    std::allocator<double>::~allocator((allocator<double> *)0x4f4325);
    std::allocator<int>::allocator((allocator<int> *)0x4f434d);
    amrex::Vector<int,_std::allocator<int>_>::vector
              ((Vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffff5e4,in_stack_fffffffffffff5e0),
               (size_type)in_stack_fffffffffffff5d8,(allocator_type *)0x4f436a);
    std::allocator<int>::~allocator((allocator<int> *)0x4f4379);
    if (lev0cellCount < 0.0) {
      lev0cellCount = getCellsCount(in_stack_fffffffffffffa28);
    }
    local_d0 = local_24;
    if (closed_chamber == 1) {
      while (local_d0 = local_d0 + -1, -1 < local_d0) {
        getLevel((PeleLM *)CONCAT44(in_stack_fffffffffffff5e4,in_stack_fffffffffffff5e0),
                 (int)((ulong)in_stack_fffffffffffff5d8 >> 0x20));
        getLevel((PeleLM *)CONCAT44(in_stack_fffffffffffff5e4,in_stack_fffffffffffff5e0),
                 (int)((ulong)in_stack_fffffffffffff5d8 >> 0x20));
        amrex::AmrLevel::get_new_data
                  ((AmrLevel *)CONCAT44(in_stack_fffffffffffff5e4,in_stack_fffffffffffff5e0),
                   (int)((ulong)in_stack_fffffffffffff5d8 >> 0x20));
        amrex::AmrLevel::get_new_data
                  ((AmrLevel *)CONCAT44(in_stack_fffffffffffff5e4,in_stack_fffffffffffff5e0),
                   (int)((ulong)in_stack_fffffffffffff5d8 >> 0x20));
        NavierStokesBase::average_down
                  (in_stack_fffffffffffff5f0,in_stack_fffffffffffff5e8,
                   (MultiFab *)CONCAT44(in_stack_fffffffffffff5e4,in_stack_fffffffffffff5e0),
                   (int)((ulong)in_stack_fffffffffffff5d8 >> 0x20),(int)in_stack_fffffffffffff5d8);
      }
      for (local_f4 = 0; local_f4 <= local_24; local_f4 = local_f4 + 1) {
        getLevel((PeleLM *)CONCAT44(in_stack_fffffffffffff5e4,in_stack_fffffffffffff5e0),
                 (int)((ulong)in_stack_fffffffffffff5d8 >> 0x20));
        amrex::AmrLevel::get_new_data
                  ((AmrLevel *)CONCAT44(in_stack_fffffffffffff5e4,in_stack_fffffffffffff5e0),
                   (int)((ulong)in_stack_fffffffffffff5d8 >> 0x20));
        if (local_f4 == 0) {
          getMFsum(in_stack_fffffffffffffb48,in_stack_fffffffffffffb40,in_stack_fffffffffffffb3c);
        }
        amrex::MultiFab::plus
                  ((MultiFab *)in_stack_fffffffffffff5f0,(Real)in_stack_fffffffffffff5e8,
                   in_stack_fffffffffffff5e4,in_stack_fffffffffffff5e0,
                   (int)((ulong)in_stack_fffffffffffff5d8 >> 0x20));
      }
    }
    NavierStokesBase::post_init_state(in_stack_ffffffffffffffa8);
    if (closed_chamber == 1) {
      for (local_10c = 0; local_10c <= local_24; local_10c = local_10c + 1) {
        getLevel((PeleLM *)CONCAT44(in_stack_fffffffffffff5e4,in_stack_fffffffffffff5e0),
                 (int)((ulong)in_stack_fffffffffffff5d8 >> 0x20));
        amrex::AmrLevel::get_new_data
                  ((AmrLevel *)CONCAT44(in_stack_fffffffffffff5e4,in_stack_fffffffffffff5e0),
                   (int)((ulong)in_stack_fffffffffffff5d8 >> 0x20));
        amrex::MultiFab::plus
                  ((MultiFab *)in_stack_fffffffffffff5f0,(Real)in_stack_fffffffffffff5e8,
                   in_stack_fffffffffffff5e4,in_stack_fffffffffffff5e0,
                   (int)((ulong)in_stack_fffffffffffff5d8 >> 0x20));
      }
    }
    NavierStokesBase::post_init_estDT
              (&in_stack_fffffffffffff6f0->super_NavierStokesBase,(Real *)in_stack_fffffffffffff6e8,
               (Vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffff6e4,in_stack_fffffffffffff6e0),
               in_stack_fffffffffffff6d8,(Real)in_stack_fffffffffffff6d0);
    if (NavierStokesBase::do_init_proj == 0 || NavierStokesBase::projector == (Projection *)0x0) {
      local_8f0 = 0;
    }
    else {
      local_8f0 = num_divu_iters;
    }
    if (NavierStokesBase::verbose != 0) {
      amrex::OutStream();
      amrex::Print::Print(in_stack_fffffffffffff610,in_stack_fffffffffffff608);
      amrex::Print::operator<<
                ((Print *)CONCAT44(in_stack_fffffffffffff5e4,in_stack_fffffffffffff5e0),
                 (char (*) [8])in_stack_fffffffffffff5d8);
      amrex::Print::operator<<
                ((Print *)CONCAT44(in_stack_fffffffffffff5e4,in_stack_fffffffffffff5e0),
                 (int *)in_stack_fffffffffffff5d8);
      amrex::Print::operator<<
                ((Print *)CONCAT44(in_stack_fffffffffffff5e4,in_stack_fffffffffffff5e0),
                 (char (*) [22])in_stack_fffffffffffff5d8);
      amrex::Print::~Print((Print *)in_stack_fffffffffffff650);
    }
    for (local_2ac = 0; local_2ac < local_8f0; local_2ac = local_2ac + 1) {
      for (local_2b0 = 0; local_2b0 <= local_24; local_2b0 = local_2b0 + 1) {
        in_stack_fffffffffffff6f0 =
             getLevel((PeleLM *)CONCAT44(in_stack_fffffffffffff5e4,in_stack_fffffffffffff5e0),
                      (int)((ulong)in_stack_fffffffffffff5d8 >> 0x20));
        iVar5 = (int)((ulong)in_stack_fffffffffffff5d8 >> 0x20);
        this_00 = (FabArrayBase *)
                  amrex::AmrLevel::get_new_data
                            ((AmrLevel *)
                             CONCAT44(in_stack_fffffffffffff5e4,in_stack_fffffffffffff5e0),iVar5);
        in_stack_fffffffffffff6d0 = amrex::FabArrayBase::boxArray(this_00);
        in_stack_fffffffffffff6d8 =
             (Vector<double,_std::allocator<double>_> *)
             amrex::FabArrayBase::DistributionMap(this_00);
        in_stack_fffffffffffff6e4 = amrex::FabArrayBase::nComp(this_00);
        amrex::MFInfo::MFInfo((MFInfo *)0x4f4957);
        in_stack_fffffffffffff6e8 =
             getLevel((PeleLM *)CONCAT44(in_stack_fffffffffffff5e4,in_stack_fffffffffffff5e0),iVar5)
        ;
        pFVar2 = amrex::AmrLevel::Factory
                           ((AmrLevel *)
                            CONCAT44(in_stack_fffffffffffff5e4,in_stack_fffffffffffff5e0));
        iVar5 = (int)((ulong)pFVar2 >> 0x20);
        amrex::MultiFab::MultiFab
                  (in_stack_fffffffffffff620,(BoxArray *)in_stack_fffffffffffff618,
                   (DistributionMapping *)in_stack_fffffffffffff610,
                   (int)((ulong)in_stack_fffffffffffff608 >> 0x20),(int)in_stack_fffffffffffff608,
                   (MFInfo *)in_stack_fffffffffffff600,in_stack_fffffffffffff630);
        amrex::MFInfo::~MFInfo((MFInfo *)0x4f49c9);
        amrex::FabArrayBase::boxArray(this_00);
        amrex::FabArrayBase::DistributionMap(this_00);
        local_608 = 0;
        uStack_600 = 0;
        local_618 = 0;
        uStack_610 = 0;
        local_5f8 = 0;
        amrex::MFInfo::MFInfo((MFInfo *)0x4f4a1f);
        getLevel((PeleLM *)CONCAT44(in_stack_fffffffffffff5e4,in_stack_fffffffffffff5e0),iVar5);
        in_stack_fffffffffffff5d8 =
             (allocator_type *)
             amrex::AmrLevel::Factory
                       ((AmrLevel *)CONCAT44(in_stack_fffffffffffff5e4,in_stack_fffffffffffff5e0));
        amrex::MultiFab::MultiFab
                  (in_stack_fffffffffffff620,(BoxArray *)in_stack_fffffffffffff618,
                   (DistributionMapping *)in_stack_fffffffffffff610,
                   (int)((ulong)in_stack_fffffffffffff608 >> 0x20),(int)in_stack_fffffffffffff608,
                   (MFInfo *)in_stack_fffffffffffff600,in_stack_fffffffffffff630);
        amrex::MFInfo::~MFInfo((MFInfo *)0x4f4a8f);
        amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                  ((FabArray<amrex::FArrayBox> *)
                   CONCAT44(in_stack_fffffffffffff5e4,in_stack_fffffffffffff5e0),
                   (value_type)in_stack_fffffffffffff5d8);
        getLevel((PeleLM *)CONCAT44(in_stack_fffffffffffff5e4,in_stack_fffffffffffff5e0),
                 (int)((ulong)in_stack_fffffffffffff5d8 >> 0x20));
        amrex::Vector<double,_std::allocator<double>_>::operator[]
                  ((Vector<double,_std::allocator<double>_> *)
                   CONCAT44(in_stack_fffffffffffff5e4,in_stack_fffffffffffff5e0),
                   (size_type)in_stack_fffffffffffff5d8);
        advance_chemistry(in_stack_00000db8,in_stack_00000db0,in_stack_00000da8,in_stack_00000da0,
                          in_stack_00000d98);
        amrex::MultiFab::~MultiFab((MultiFab *)0x4f4b28);
        amrex::MultiFab::~MultiFab((MultiFab *)0x4f4b35);
      }
      for (local_61c = 0; local_61c <= local_24; local_61c = local_61c + 1) {
        getLevel((PeleLM *)CONCAT44(in_stack_fffffffffffff5e4,in_stack_fffffffffffff5e0),
                 (int)((ulong)in_stack_fffffffffffff5d8 >> 0x20));
        local_628 = amrex::AmrLevel::get_new_data
                              ((AmrLevel *)
                               CONCAT44(in_stack_fffffffffffff5e4,in_stack_fffffffffffff5e0),
                               (int)((ulong)in_stack_fffffffffffff5d8 >> 0x20));
        pPVar3 = getLevel((PeleLM *)CONCAT44(in_stack_fffffffffffff5e4,in_stack_fffffffffffff5e0),
                          (int)((ulong)in_stack_fffffffffffff5d8 >> 0x20));
        RVar1 = local_20;
        pdVar4 = amrex::Vector<double,_std::allocator<double>_>::operator[]
                           ((Vector<double,_std::allocator<double>_> *)
                            CONCAT44(in_stack_fffffffffffff5e4,in_stack_fffffffffffff5e0),
                            (size_type)in_stack_fffffffffffff5d8);
        (*(pPVar3->super_NavierStokesBase).super_AmrLevel._vptr_AmrLevel[0x2d])
                  (RVar1,SUB84(*pdVar4,0),pPVar3,local_628);
      }
      iVar5 = local_24;
      if (hack_noavgdivu == 0) {
        while (local_62c = iVar5 + -1, -1 < local_62c) {
          local_638 = getLevel((PeleLM *)
                               CONCAT44(in_stack_fffffffffffff5e4,in_stack_fffffffffffff5e0),
                               (int)((ulong)in_stack_fffffffffffff5d8 >> 0x20));
          local_640 = getLevel((PeleLM *)
                               CONCAT44(in_stack_fffffffffffff5e4,in_stack_fffffffffffff5e0),
                               (int)((ulong)in_stack_fffffffffffff5d8 >> 0x20));
          local_648 = amrex::AmrLevel::get_new_data
                                ((AmrLevel *)
                                 CONCAT44(in_stack_fffffffffffff5e4,in_stack_fffffffffffff5e0),
                                 (int)((ulong)in_stack_fffffffffffff5d8 >> 0x20));
          local_650 = amrex::AmrLevel::get_new_data
                                ((AmrLevel *)
                                 CONCAT44(in_stack_fffffffffffff5e4,in_stack_fffffffffffff5e0),
                                 (int)((ulong)in_stack_fffffffffffff5d8 >> 0x20));
          NavierStokesBase::average_down
                    (in_stack_fffffffffffff5f0,in_stack_fffffffffffff5e8,
                     (MultiFab *)CONCAT44(in_stack_fffffffffffff5e4,in_stack_fffffffffffff5e0),
                     (int)((ulong)in_stack_fffffffffffff5d8 >> 0x20),(int)in_stack_fffffffffffff5d8)
          ;
          iVar5 = local_62c;
        }
      }
      amrex::Vector<amrex::StateData,_std::allocator<amrex::StateData>_>::operator[]
                ((Vector<amrex::StateData,_std::allocator<amrex::StateData>_> *)
                 CONCAT44(in_stack_fffffffffffff5e4,in_stack_fffffffffffff5e0),
                 (size_type)in_stack_fffffffffffff5d8);
      local_658 = amrex::StateData::curTime(in_stack_fffffffffffff600);
      local_65c = 1;
      if (closed_chamber == 1) {
        for (local_660 = 0; local_660 <= local_24; local_660 = local_660 + 1) {
          getLevel((PeleLM *)CONCAT44(in_stack_fffffffffffff5e4,in_stack_fffffffffffff5e0),
                   (int)((ulong)in_stack_fffffffffffff5d8 >> 0x20));
          local_668 = amrex::AmrLevel::get_new_data
                                ((AmrLevel *)
                                 CONCAT44(in_stack_fffffffffffff5e4,in_stack_fffffffffffff5e0),
                                 (int)((ulong)in_stack_fffffffffffff5d8 >> 0x20));
          if (local_660 == 0) {
            local_670 = getMFsum(in_stack_fffffffffffffb48,in_stack_fffffffffffffb40,
                                 in_stack_fffffffffffffb3c);
          }
          amrex::MultiFab::plus
                    ((MultiFab *)in_stack_fffffffffffff5f0,(Real)in_stack_fffffffffffff5e8,
                     in_stack_fffffffffffff5e4,in_stack_fffffffffffff5e0,
                     (int)((ulong)in_stack_fffffffffffff5d8 >> 0x20));
        }
      }
      Projection::initialVelocityProject
                (in_stack_000007c8,in_stack_000007c4,in_stack_000007b8,in_stack_000007b4,
                 in_stack_000007b0);
      iVar5 = local_24;
      if (closed_chamber == 1) {
        for (local_674 = 0; iVar5 = local_24, local_674 <= local_24; local_674 = local_674 + 1) {
          getLevel((PeleLM *)CONCAT44(in_stack_fffffffffffff5e4,in_stack_fffffffffffff5e0),
                   (int)((ulong)in_stack_fffffffffffff5d8 >> 0x20));
          local_680 = amrex::AmrLevel::get_new_data
                                ((AmrLevel *)
                                 CONCAT44(in_stack_fffffffffffff5e4,in_stack_fffffffffffff5e0),
                                 (int)((ulong)in_stack_fffffffffffff5d8 >> 0x20));
          amrex::MultiFab::plus
                    ((MultiFab *)in_stack_fffffffffffff5f0,(Real)in_stack_fffffffffffff5e8,
                     in_stack_fffffffffffff5e4,in_stack_fffffffffffff5e0,
                     (int)((ulong)in_stack_fffffffffffff5d8 >> 0x20));
        }
      }
      while (local_684 = iVar5 + -1, -1 < local_684) {
        local_690 = getLevel((PeleLM *)CONCAT44(in_stack_fffffffffffff5e4,in_stack_fffffffffffff5e0)
                             ,(int)((ulong)in_stack_fffffffffffff5d8 >> 0x20));
        in_stack_fffffffffffff650 =
             getLevel((PeleLM *)CONCAT44(in_stack_fffffffffffff5e4,in_stack_fffffffffffff5e0),
                      (int)((ulong)in_stack_fffffffffffff5d8 >> 0x20));
        local_698 = in_stack_fffffffffffff650;
        local_6a0 = amrex::AmrLevel::get_new_data
                              ((AmrLevel *)
                               CONCAT44(in_stack_fffffffffffff5e4,in_stack_fffffffffffff5e0),
                               (int)((ulong)in_stack_fffffffffffff5d8 >> 0x20));
        local_6a8 = amrex::AmrLevel::get_new_data
                              ((AmrLevel *)
                               CONCAT44(in_stack_fffffffffffff5e4,in_stack_fffffffffffff5e0),
                               (int)((ulong)in_stack_fffffffffffff5d8 >> 0x20));
        NavierStokesBase::average_down
                  (in_stack_fffffffffffff5f0,in_stack_fffffffffffff5e8,
                   (MultiFab *)CONCAT44(in_stack_fffffffffffff5e4,in_stack_fffffffffffff5e0),
                   (int)((ulong)in_stack_fffffffffffff5d8 >> 0x20),(int)in_stack_fffffffffffff5d8);
        iVar5 = local_684;
      }
      amrex::Amr::setNCycle
                ((Amr *)in_stack_fffffffffffff5f0,
                 (Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff5e8);
      NavierStokesBase::post_init_estDT
                (&in_stack_fffffffffffff6f0->super_NavierStokesBase,
                 (Real *)in_stack_fffffffffffff6e8,
                 (Vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_fffffffffffff6e4,in_stack_fffffffffffff6e0),
                 in_stack_fffffffffffff6d8,(Real)in_stack_fffffffffffff6d0);
      pdVar4 = std::min<double>(&local_30,&local_38);
      local_30 = *pdVar4;
      in_stack_fffffffffffff630 = (FabFactory<amrex::FArrayBox> *)(long)(local_24 + 1);
      std::allocator<double>::allocator((allocator<double> *)0x4f514c);
      amrex::Vector<double,_std::allocator<double>_>::vector
                ((Vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff5f0,
                 (size_type)in_stack_fffffffffffff5e8,
                 (value_type_conflict1 *)
                 CONCAT44(in_stack_fffffffffffff5e4,in_stack_fffffffffffff5e0),
                 in_stack_fffffffffffff5d8);
      std::allocator<double>::~allocator((allocator<double> *)0x4f517a);
      amrex::Amr::setDtLevel
                ((Amr *)in_stack_fffffffffffff5f0,
                 (Vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff5e8);
      for (local_6c8 = 0; local_6c8 <= local_24; local_6c8 = local_6c8 + 1) {
        in_stack_fffffffffffff620 =
             (MultiFab *)
             amrex::Vector<double,_std::allocator<double>_>::operator[]
                       ((Vector<double,_std::allocator<double>_> *)
                        CONCAT44(in_stack_fffffffffffff5e4,in_stack_fffffffffffff5e0),
                        (size_type)in_stack_fffffffffffff5d8);
        pdVar4 = amrex::Vector<double,_std::allocator<double>_>::operator[]
                           ((Vector<double,_std::allocator<double>_> *)
                            CONCAT44(in_stack_fffffffffffff5e4,in_stack_fffffffffffff5e0),
                            (size_type)in_stack_fffffffffffff5d8);
        pdVar4 = std::min<double>((double *)in_stack_fffffffffffff620,pdVar4);
        in_stack_fffffffffffff610 = (Print *)*pdVar4;
        pdVar4 = amrex::Vector<double,_std::allocator<double>_>::operator[]
                           ((Vector<double,_std::allocator<double>_> *)
                            CONCAT44(in_stack_fffffffffffff5e4,in_stack_fffffffffffff5e0),
                            (size_type)in_stack_fffffffffffff5d8);
        *pdVar4 = (double)in_stack_fffffffffffff610;
        in_stack_fffffffffffff618 =
             getLevel((PeleLM *)CONCAT44(in_stack_fffffffffffff5e4,in_stack_fffffffffffff5e0),
                      (int)((ulong)in_stack_fffffffffffff5d8 >> 0x20));
        (*(in_stack_fffffffffffff618->super_NavierStokesBase).super_AmrLevel._vptr_AmrLevel[0x18])
                  (local_20,SUB84(local_30,0));
      }
      amrex::Vector<double,_std::allocator<double>_>::~Vector
                ((Vector<double,_std::allocator<double>_> *)0x4f52da);
    }
    post_init_press(in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98,in_stack_fffffffffffffa90,
                    in_stack_fffffffffffffa88);
    if (0 < NavierStokesBase::sum_interval) {
      (**(code **)(*in_RDI + 0x1c0))();
    }
    if (2 < NavierStokesBase::verbose) {
      local_6cc = amrex::ParallelDescriptor::IOProcessorNumber();
      local_6d8 = amrex::ParallelDescriptor::second();
      local_6d8 = local_6d8 - local_18;
      amrex::ParallelDescriptor::ReduceRealMax<double>(&local_6d8,local_6cc);
      os_ = amrex::OutStream();
      amrex::Print::Print(in_stack_fffffffffffff610,os_);
      amrex::Print::operator<<
                ((Print *)CONCAT44(in_stack_fffffffffffff5e4,in_stack_fffffffffffff5e0),
                 (char (*) [33])in_stack_fffffffffffff5d8);
      amrex::Print::operator<<
                ((Print *)CONCAT44(in_stack_fffffffffffff5e4,in_stack_fffffffffffff5e0),
                 (int *)in_stack_fffffffffffff5d8);
      amrex::Print::operator<<
                ((Print *)CONCAT44(in_stack_fffffffffffff5e4,in_stack_fffffffffffff5e0),
                 (char (*) [9])in_stack_fffffffffffff5d8);
      amrex::Print::operator<<
                ((Print *)CONCAT44(in_stack_fffffffffffff5e4,in_stack_fffffffffffff5e0),
                 (double *)in_stack_fffffffffffff5d8);
      amrex::Print::operator<<
                ((Print *)CONCAT44(in_stack_fffffffffffff5e4,in_stack_fffffffffffff5e0),
                 (char *)in_stack_fffffffffffff5d8);
      amrex::Print::~Print((Print *)in_stack_fffffffffffff650);
    }
    amrex::Vector<int,_std::allocator<int>_>::~Vector((Vector<int,_std::allocator<int>_> *)0x4f546c)
    ;
    amrex::Vector<double,_std::allocator<double>_>::~Vector
              ((Vector<double,_std::allocator<double>_> *)0x4f5479);
    amrex::Vector<int,_std::allocator<int>_>::~Vector((Vector<int,_std::allocator<int>_> *)0x4f5486)
    ;
    amrex::Vector<double,_std::allocator<double>_>::~Vector
              ((Vector<double,_std::allocator<double>_> *)0x4f5493);
  }
  return;
}

Assistant:

void
PeleLM::post_init (Real stop_time)
{
  BL_PROFILE("PLM::post_init()");
  if (level > 0)
    //
    // Nothing to sync up at level > 0.
    //
    return;

  const Real strt_time    = ParallelDescriptor::second();
  const Real tnp1         = state[State_Type].curTime();
  const int  finest_level = parent->finestLevel();
  Real dt_init  = 0.0;
  Real dt_init2 = 0.0;
  Real Sbar     = 0.0;

  Vector<Real> dt_save(finest_level+1);
  Vector<int>  nc_save(finest_level+1);
  Vector<Real> dt_save2(finest_level+1);
  Vector<int>  nc_save2(finest_level+1);

  // Get level 0 cells count / uncovered cells count with EB
  if ( lev0cellCount < 0.0 ) {
     lev0cellCount = getCellsCount();
  }

  // ensure system is solvable by creating deltaS = S - Sbar
  if (closed_chamber == 1)
  {
    // ensure divu is average down so computing deltaS = S - Sbar works for multilevel
    for (int lev = finest_level-1; lev >= 0; lev--)
    {
      PeleLM&   fine_lev = getLevel(lev+1);
      PeleLM&   crse_lev = getLevel(lev);

      MultiFab& Divu_crse = crse_lev.get_new_data(Divu_Type);
      MultiFab& Divu_fine = fine_lev.get_new_data(Divu_Type);

      crse_lev.average_down(Divu_fine, Divu_crse, 0, 1);
    }

    // compute Sbar and subtract from S
    for (int lev = 0; lev <= finest_level; lev++)
    {
      // pointer to S
      MultiFab& divu_lev = getLevel(lev).get_new_data(Divu_Type);
      if (lev == 0) {
        // Get S sum
        Real Ssum = getMFsum(divu_lev,0);

        // Normalize by cell count / uncovered cell count if EB
        Sbar = Ssum/lev0cellCount;
      }
      divu_lev.plus(-Sbar,0,1);
    }
  }

  //
  // Ensure state is consistent, i.e. velocity field satisfies initial
  // estimate of constraint, coarse levels are fine level averages, pressure
  // is zero.
  //
  post_init_state();

  if (closed_chamber == 1)
  {
    // restore S
    for (int lev = 0; lev <= finest_level; lev++)
    {
      MultiFab& divu_lev = getLevel(lev).get_new_data(Divu_Type);
      divu_lev.plus(Sbar,0,1);
    }
  }

  //
  // Estimate the initial timestepping.
  //
  post_init_estDT(dt_init,nc_save,dt_save,stop_time);
  //
  // Better estimate needs dt to estimate divu
  //
  const bool do_iter        = do_init_proj && projector;
  const int  init_divu_iter = do_iter ? num_divu_iters : 0;

  if (verbose) {
    amrex::Print() << " Doing " << num_divu_iters << " initial divu iters \n";
  }
  for (int iter = 0; iter < init_divu_iter; ++iter)
  {
    //
    // Update species destruction rates in each level but not state.
    //
    if (NUM_SPECIES > 0)
    {

      for (int k = 0; k <= finest_level; k++)
      {

        MultiFab& S_new = getLevel(k).get_new_data(State_Type);

        //
        // Don't update S_new in this strang_chem() call ...
        //
        MultiFab S_tmp(S_new.boxArray(),S_new.DistributionMap(),S_new.nComp(),0,MFInfo(),getLevel(k).Factory());
        MultiFab Forcing_tmp(S_new.boxArray(),S_new.DistributionMap(),NUM_SPECIES+1,0,MFInfo(),getLevel(k).Factory());
        Forcing_tmp.setVal(0);

        getLevel(k).advance_chemistry(S_new,S_tmp,dt_save[k]/2.0,Forcing_tmp);
      }
    }
    //
    // Recompute the velocity to obey constraint with chemistry and
    // divqrad and then average that down.
    //
    if (NUM_SPECIES > 0)
    {
      for (int k = 0; k <= finest_level; k++)
      {
        MultiFab&  Divu_new = getLevel(k).get_new_data(Divu_Type);
        getLevel(k).calc_divu(tnp1,dt_save[k],Divu_new);
      }

      if (!hack_noavgdivu)
      {
        for (int lev = finest_level-1; lev >= 0; lev--)
        {
          PeleLM&   fine_lev = getLevel(lev+1);
          PeleLM&   crse_lev = getLevel(lev);
          MultiFab& Divu_crse = crse_lev.get_new_data(Divu_Type);
          MultiFab& Divu_fine = fine_lev.get_new_data(Divu_Type);
          crse_lev.average_down(Divu_fine, Divu_crse, 0, 1);
        }
      }
      //
      // Recompute the initial velocity field based on this new constraint
      //
      const Real divu_time = state[Divu_Type].curTime();

      int havedivu = 1;

      // ensure system is solvable by creating deltaS = S - Sbar
      if (closed_chamber == 1)
      {
        // compute Sbar and subtract from S
        for (int lev = 0; lev <= finest_level; lev++)
        {
          // pointer to S
          MultiFab& divu_lev = getLevel(lev).get_new_data(Divu_Type);
          if (lev == 0) {
             // Get S sum
             Real Ssum = getMFsum(divu_lev,0);

             // Normalize by cell count / uncovered cell count if EB
             Sbar = Ssum/lev0cellCount;
          }
          divu_lev.plus(-Sbar,0,1);
        }
      }

      projector->initialVelocityProject(0,divu_time,havedivu,1);

      if (closed_chamber == 1)
      {
        // restore S
        for (int lev = 0; lev <= finest_level; lev++)
        {
          MultiFab& divu_lev = getLevel(lev).get_new_data(Divu_Type);
          divu_lev.plus(Sbar,0,1);
        }
      }

      //
      // Average down the new velocity
      //
      for (int k = finest_level-1; k >= 0; k--)
      {
        PeleLM&   fine_lev = getLevel(k+1);
        PeleLM&   crse_lev = getLevel(k);
        MultiFab&       S_fine  = fine_lev.get_new_data(State_Type);
        MultiFab&       S_crse  = crse_lev.get_new_data(State_Type);

        crse_lev.average_down(S_fine, S_crse, Xvel, AMREX_SPACEDIM);
      }
    }
    //
    // Estimate the initial timestepping again, using new velocity
    // (necessary?) Need to pass space to save dt, nc, but these are
    // hacked, just pass something.
    //
    // reset Ncycle to nref...
    //
    parent->setNCycle(nc_save);
    post_init_estDT(dt_init2, nc_save2, dt_save2, stop_time);
    //
    // Compute dt_init,dt_save as the minimum of the values computed
    // in the calls to post_init_estDT
    // Then setTimeLevel and dt_level to these values.
    //
    dt_init = std::min(dt_init,dt_init2);
    Vector<Real> dt_level(finest_level+1,dt_init);

    parent->setDtLevel(dt_level);
    for (int k = 0; k <= finest_level; k++)
    {
      dt_save[k] = std::min(dt_save[k],dt_save2[k]);
      getLevel(k).setTimeLevel(tnp1,dt_init,dt_init);
    }
  } // end divu_iters

  //
  // Initialize the pressure by iterating the initial timestep.
  //
  post_init_press(dt_init, nc_save, dt_save);
  //
  // Compute the initial estimate of conservation.
  //
  if (sum_interval > 0)
    sum_integrated_quantities();

  if (verbose > 2)
  {
    const int IOProc   = ParallelDescriptor::IOProcessorNumber();
    Real      run_time = ParallelDescriptor::second() - strt_time;

    ParallelDescriptor::ReduceRealMax(run_time,IOProc);

    amrex::Print() << "      PeleLM::post_init(): lev: " << level << ", time: " << run_time << '\n';
  }
}